

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

void cs::collect_garbage(context_t *context)

{
  bool bVar1;
  element_type *__r;
  __shared_ptr *in_RDI;
  domain_manager *in_stack_ffffffffffffff80;
  shared_ptr<cs::compiler_type> *this;
  context_t *in_stack_ffffffffffffff90;
  compiler_type *in_stack_ffffffffffffff98;
  stack_type<cs_impl::any,_std::allocator> *in_stack_ffffffffffffffc0;
  shared_ptr<cs::compiler_type> local_28 [2];
  __shared_ptr *local_8;
  
  local_8 = in_RDI;
  while (bVar1 = stack_type<cs_impl::any,_std::allocator>::empty
                           ((stack_type<cs_impl::any,_std::allocator> *)(current_process + 0x80)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    stack_type<cs_impl::any,_std::allocator>::pop_no_return(in_stack_ffffffffffffffc0);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_8);
  if (bVar1) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a828);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a834);
    domain_manager::clear_all_data(in_stack_ffffffffffffff80);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a84d);
    std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a855);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
    ::clear((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
             *)in_stack_ffffffffffffff80);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a86e);
    std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a876);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
    ::clear((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
             *)in_stack_ffffffffffffff80);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a88f);
    __r = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x20a897);
    this = local_28;
    std::shared_ptr<cs::context_type>::shared_ptr((shared_ptr<cs::context_type> *)this,__r);
    compiler_type::swap_context(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x20a8cd);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x20a8d7);
    std::shared_ptr<cs::context_type>::shared_ptr((shared_ptr<cs::context_type> *)this,__r);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a8f2);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a8fe);
    std::shared_ptr<cs::context_type>::operator=
              ((shared_ptr<cs::context_type> *)this,(shared_ptr<cs::context_type> *)__r);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x20a91c);
    std::shared_ptr<cs::compiler_type>::shared_ptr(this,__r);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a937);
    std::shared_ptr<cs::compiler_type>::operator=(this,(shared_ptr<cs::compiler_type> *)__r);
    std::shared_ptr<cs::compiler_type>::~shared_ptr((shared_ptr<cs::compiler_type> *)0x20a94e);
    std::shared_ptr<cs::instance_type>::shared_ptr((shared_ptr<cs::instance_type> *)this,__r);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x20a969);
    std::shared_ptr<cs::instance_type>::operator=
              ((shared_ptr<cs::instance_type> *)this,(shared_ptr<cs::instance_type> *)__r);
    std::shared_ptr<cs::instance_type>::~shared_ptr((shared_ptr<cs::instance_type> *)0x20a984);
    std::shared_ptr<cs::context_type>::shared_ptr((shared_ptr<cs::context_type> *)this,__r);
    std::shared_ptr<cs::context_type>::operator=
              ((shared_ptr<cs::context_type> *)this,(shared_ptr<cs::context_type> *)__r);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x20a9ae);
  }
  collect_garbage();
  return;
}

Assistant:

void collect_garbage(context_t &context)
	{
		while (!current_process->stack.empty())
			current_process->stack.pop_no_return();
#ifdef CS_DEBUGGER
		while(!current_process->stack_backtrace.empty())
			current_process->stack_backtrace.pop_no_return();
#endif
		if (context) {
			context->instance->storage.clear_all_data();
			context->compiler->modules.clear();
			context->compiler->csyms.clear();
			context->compiler->swap_context(nullptr);
			context->instance->context = nullptr;
			context->compiler = nullptr;
			context->instance = nullptr;
			context = nullptr;
		}
		collect_garbage();
	}